

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O2

vbignum_t * __thiscall vbignum_t::operator-(vbignum_t *this,vbignum_t *b)

{
  vbignum_t *this_00;
  ushort uVar1;
  
  this_00 = (vbignum_t *)operator_new(8);
  this_00->ext_ = (char *)0x0;
  uVar1 = *(ushort *)b->ext_;
  if (*(ushort *)b->ext_ < *(ushort *)this->ext_) {
    uVar1 = *(ushort *)this->ext_;
  }
  init(this_00,(EVP_PKEY_CTX *)(ulong)uVar1);
  CVmObjBigNum::compute_diff_into(this_00->ext_,this->ext_,b->ext_);
  return this_00;
}

Assistant:

vbignum_t *operator -(const vbignum_t &b) const
    {
        vbignum_t *res = new vbignum_t();
        res->init(maxprec(this, &b));
        CVmObjBigNum::compute_diff_into(res->ext_, ext_, b.ext_);
        return res;
    }